

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_103207::RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test::TestBody
          (RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test *this)

{
  MIPInstance *this_00;
  initializer_list<mp::var::Type> tys;
  bool bVar1;
  char *in_R9;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<mip_converter_test::MIPInstance::Objective> __l_01;
  initializer_list<double> lbs;
  initializer_list<double> __l_02;
  initializer_list<int> __l_03;
  initializer_list<mip_converter_test::MIPInstance::Constraint> __l_04;
  initializer_list<double> ubs;
  allocator_type local_8796;
  allocator_type local_8795;
  allocator_type local_8794;
  allocator_type local_8793;
  allocator_type local_8792;
  allocator_type local_8791;
  _Vector_base<int,_std::allocator<int>_> local_8790;
  AssertHelper local_8778;
  undefined8 uStack_8770;
  undefined8 local_8768;
  string local_8758;
  AssertionResult gtest_ar_;
  _Vector_base<int,_std::allocator<int>_> local_8708;
  _Vector_base<double,_std::allocator<double>_> local_86f0;
  undefined8 local_86d8;
  undefined8 uStack_86d0;
  int local_86bc [9];
  MIPInstance milp;
  double local_85c8 [4];
  double local_85a8 [3];
  Env e;
  MIPConverterTester tester;
  
  e.super_ErrorHandler._vptr_ErrorHandler._0_4_ = 0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x3ff00000000000;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_8758,__l,&local_8791);
  local_86bc[6] = 0;
  local_86bc[7] = 1;
  local_86bc[8] = 2;
  __l_00._M_len = 3;
  __l_00._M_array = local_86bc + 6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_8790,__l_00,&local_8792);
  mip_converter_test::MIPInstance::SparseVec::SparseVec
            ((SparseVec *)&e.super_OutputHandler,
             (vector<double,_std::allocator<double>_> *)&local_8758,
             (vector<int,_std::allocator<int>_> *)&local_8790);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&e;
  std::
  vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
  ::vector(&milp.objs_,__l_01,&local_8793);
  local_8778.data_ = (AssertHelperData *)0x0;
  uStack_8770 = 0;
  local_8768 = 0xbff3333333333333;
  local_85a8[0] = 1.0;
  local_85a8[1] = 3.0;
  local_85a8[2] = 5.2;
  local_86bc[3] = 1;
  local_86bc[4] = 0;
  local_86bc[5] = 0;
  local_86d8 = 0;
  uStack_86d0 = 0;
  tys._M_len = 3;
  tys._M_array = (iterator)(local_86bc + 3);
  lbs._M_len = 3;
  lbs._M_array = (iterator)&local_8778;
  ubs._M_len = 3;
  ubs._M_array = local_85a8;
  mp::VarArrayDef::VarArrayDef(&milp.vars_,lbs,ubs,tys,(initializer_list<const_char_*>)ZEXT816(0));
  local_85c8[0] = 2.0;
  local_85c8[1] = 0.0;
  local_85c8[2] = 4.0;
  __l_02._M_len = 3;
  __l_02._M_array = local_85c8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_86f0,__l_02,&local_8794);
  local_86bc[0] = 0;
  local_86bc[1] = 1;
  local_86bc[2] = 2;
  __l_03._M_len = 3;
  __l_03._M_array = local_86bc;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_8708,__l_03,&local_8795);
  mip_converter_test::MIPInstance::SparseVec::SparseVec
            ((SparseVec *)&tester,(vector<double,_std::allocator<double>_> *)&local_86f0,
             (vector<int,_std::allocator<int>_> *)&local_8708);
  tester.
  super_ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
  .factory_.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0xd4b249ad2594c37d;
  tester.
  super_ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
  .factory_.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x404c333333333333;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&tester;
  std::
  vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
  ::vector(&milp.cons_,__l_04,&local_8796);
  mip_converter_test::MIPInstance::SparseVec::~SparseVec((SparseVec *)&tester);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_8708);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_86f0);
  mip_converter_test::MIPInstance::SparseVec::~SparseVec((SparseVec *)&e.super_OutputHandler);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_8790);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_8758);
  mp::BasicSolver::BasicSolver(&e);
  mip_converter_test::MIPConverterTester::MIPConverterTester(&tester,&e);
  mip_converter_test::feedInstance<mip_converter_test::MIPConverterTester>(&tester,&milp);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ConvertModel((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)&tester);
  this_00 = (MIPInstance *)
            ((long)&tester.
                    super_ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    .
                    super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    .flat_cvt_.
                    super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    .
                    super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    .modelapi_ + 0x10);
  bVar1 = std::operator==((vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
                           *)this_00,&milp.objs_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ = mip_converter_test::MIPInstance::VarBoundsEqual(this_00,&milp);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ =
           (long)tester.
                 super_ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .
                 super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .flat_cvt_.
                 super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 .
                 super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 .modelapi_.instance_.cons_.
                 super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)tester.
                 super_ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .
                 super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .flat_cvt_.
                 super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 .
                 super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 .modelapi_.instance_.cons_.
                 super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
           (long)milp.cons_.
                 super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)milp.cons_.
                 super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (gtest_ar_.success_) goto LAB_0012eb14;
      testing::Message::Message((Message *)&local_8790);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_8758,(internal *)&gtest_ar_,(AssertionResult *)"tester.NConstrEqual(milp)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_8778,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-mip-test.cpp"
                 ,0x35,local_8758._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_8778,(Message *)&local_8790);
    }
    else {
      testing::Message::Message((Message *)&local_8790);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_8758,(internal *)&gtest_ar_,(AssertionResult *)"tester.VarBoundsEqual(milp)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_8778,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-mip-test.cpp"
                 ,0x34,local_8758._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_8778,(Message *)&local_8790);
    }
  }
  else {
    testing::Message::Message((Message *)&local_8790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8758,(internal *)&gtest_ar_,(AssertionResult *)"tester.ObjsEqual(milp)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_8778,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-mip-test.cpp"
               ,0x33,local_8758._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_8778,(Message *)&local_8790);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_8778);
  std::__cxx11::string::~string((string *)&local_8758);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_8790);
LAB_0012eb14:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~ProblemFlattener((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)&tester);
  mp::BasicSolver::~BasicSolver(&e);
  mip_converter_test::MIPInstance::~MIPInstance(&milp);
  return;
}

Assistant:

TEST(RedefsMIPTest, PureMILP__01__seemsPassedToBackendCorrectly) {
  MIPInstance milp {
    { { minimize_,
        { { 1, 1, 2.5 },
          { 0, 1, 2 } } } },
    { {  0.0,  0.0, -1.2 },
      {  1.0,  3.0,  5.2 },
      {  I_,   F_,   F_ } },
    {
      { { { 2, 0.0, 4 },
          { 0, 1,   2 } }, -infty_, 56.4 }
    }
  };
  mp::Env e;
  MIPConverterTester tester(e);
  feedInstance(tester, milp);
  tester.ConvertModel();
  ASSERT_TRUE(tester.ObjsEqual(milp));
  ASSERT_TRUE(tester.VarBoundsEqual(milp));
  ASSERT_TRUE(tester.NConstrEqual(milp));
}